

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

void gf2RedTrinomial0(word *a,size_t n,gf2_trinom_st *p)

{
  ulong uVar1;
  long lVar2;
  word hi;
  gf2_trinom_st *p_local;
  size_t n_local;
  word *a_local;
  
  n_local = n << 1;
  while (n_local = n_local - 1, p->wm < n_local) {
    uVar1 = a[n_local];
    lVar2 = (n_local - p->wm) + -1;
    a[lVar2] = uVar1 << (0x40U - (char)p->bm & 0x3f) ^ a[lVar2];
    lVar2 = n_local - p->wm;
    a[lVar2] = uVar1 >> ((byte)p->bm & 0x3f) ^ a[lVar2];
    lVar2 = n_local - p->wk;
    a[lVar2] = uVar1 ^ a[lVar2];
  }
  uVar1 = a[n_local] >> ((byte)p->bm & 0x3f);
  *a = uVar1 ^ *a;
  uVar1 = uVar1 << ((byte)p->bm & 0x3f);
  lVar2 = n_local - p->wk;
  a[lVar2] = uVar1 ^ a[lVar2];
  a[n_local] = uVar1 ^ a[n_local];
  return;
}

Assistant:

static void gf2RedTrinomial0(word a[], size_t n, const gf2_trinom_st* p)
{
	register word hi;
	// pre
	ASSERT(wwIsValid(a, 2 * n));
	ASSERT(memIsValid(p, sizeof(*p)));
	ASSERT(p->m % 8 != 0);
	ASSERT(p->m > p->k && p->k > 0);
	ASSERT(p->m - p->k >= B_PER_W);
	ASSERT(p->bm < B_PER_W && p->bk < B_PER_W);
	ASSERT(p->m == p->wm * B_PER_W + p->bm);
	ASSERT(p->m == p->k + p->wk * B_PER_W + p->bk);
	ASSERT(n == W_OF_B(p->m));
	ASSERT(p->bk == 0);
	// обработать старшие слова
	n *= 2;
	while (--n > p->wm)
	{
		hi = a[n];
		a[n - p->wm - 1] ^= hi << (B_PER_W - p->bm);
		a[n - p->wm] ^= hi >> p->bm;
		a[n - p->wk] ^= hi;
	}
	// слово, на которое попадает моном x^m
	ASSERT(n == p->wm);
	hi = a[n] >> p->bm;
	a[0] ^= hi;
	hi <<= p->bm;
	a[n - p->wk] ^= hi;
	a[n] ^= hi;
	// очистка
	hi = 0;
}